

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trie.c
# Opt level: O1

void nn_node_term(nn_trie_node *self)

{
  uint uVar1;
  ulong uVar2;
  
  if (self != (nn_trie_node *)0x0) {
    uVar1 = (uint)self->type;
    if (8 < self->type) {
      uVar1 = ((uint)(self->u).sparse.children[1] - (uint)(self->u).sparse.children[0]) + 1;
    }
    if (uVar1 != 0) {
      uVar2 = 0;
      do {
        nn_node_term(*(nn_trie_node **)(self[1].prefix + uVar2 * 8 + -6));
        uVar2 = uVar2 + 1;
      } while (uVar1 != uVar2);
    }
    free(self);
    return;
  }
  return;
}

Assistant:

void nn_node_term (struct nn_trie_node *self)
{
    int children;
    int i;

    /*  Trivial case of the recursive algorithm. */
    if (!self)
        return;

    /*  Recursively destroy the child nodes. */
    children = self->type <= NN_TRIE_SPARSE_MAX ?
        self->type : (self->u.dense.max - self->u.dense.min + 1);
    for (i = 0; i != children; ++i)
        nn_node_term (*nn_node_child (self, i));

    /*  Deallocate this node. */
    nn_free (self);
}